

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_dotted_table
          (serializer<toml::type_config> *this,table_type *t,table_format_info *fmt,
          source_location *param_4,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  bool bVar1;
  reference pvVar2;
  table_format_info *ptVar3;
  table_type *in_RCX;
  serializer<toml::type_config> *in_RDX;
  long in_RSI;
  string_type *in_RDI;
  table_format_info *in_R8;
  source_location *in_R9;
  basic_value<toml::type_config> *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  value_type *kv;
  const_iterator __end0;
  const_iterator __begin0;
  table_type *__range3;
  string_type *retval;
  value_type *in_stack_000005c0;
  serializer<toml::type_config> *in_stack_000005c8;
  basic_value<toml::type_config> *in_stack_fffffffffffffe08;
  source_location *in_stack_fffffffffffffe10;
  value_type *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_value<toml::type_config> *in_stack_fffffffffffffe50;
  indent_char in_stack_fffffffffffffe87;
  serializer<toml::type_config> *in_stack_fffffffffffffe88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe90;
  serializer<toml::type_config> *in_stack_fffffffffffffe98;
  indent_char in_stack_fffffffffffffeaf;
  preserve_comments *in_stack_fffffffffffffeb0;
  serializer<toml::type_config> *in_stack_fffffffffffffeb8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_48 [2];
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar4;
  
  uVar4 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffffe20);
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                *)in_stack_fffffffffffffe08);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
              *)in_stack_fffffffffffffe08);
  while (bVar1 = std::__detail::operator==(local_48,&local_50), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
             ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                          *)0x713f75);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    bVar1 = basic_value<toml::type_config>::is_table((basic_value<toml::type_config> *)0x713fc5);
    if (((bVar1) &&
        (ptVar3 = basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffffe50),
        ptVar3->fmt != oneline)) &&
       (in_stack_fffffffffffffe20 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffffe50),
       *(table_format *)&(in_stack_fffffffffffffe20->_M_dataplus)._M_p != multiline_oneline)) {
      in_stack_fffffffffffffe18 =
           (value_type *)
           basic_value<toml::type_config>::as_table_abi_cxx11_(in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe10 =
           (source_location *)
           basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffffe50);
      basic_value<toml::type_config>::location(in_stack_fffffffffffffe08);
      format_dotted_table(in_RDX,in_RCX,in_R8,in_R9,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(uVar4,in_stack_ffffffffffffffc8));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe08);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10);
      source_location::~source_location(in_stack_fffffffffffffe10);
    }
    else {
      basic_value<toml::type_config>::comments(&pvVar2->second);
      format_comments_abi_cxx11_
                (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeaf);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe08);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10);
      format_indent_abi_cxx11_(in_stack_fffffffffffffe88,in_stack_fffffffffffffe87);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe08);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10);
      format_keys(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe08 =
           (basic_value<toml::type_config> *)
           std::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffe10);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe08);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x7141f2);
      string_conv<std::__cxx11::string,4ul>((char (*) [4])in_stack_fffffffffffffe08);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe08);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10);
      *(undefined1 *)(in_RSI + 0x18) = 1;
      operator()[abi_cxx11_(in_stack_000005c8,in_stack_000005c0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe08);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10,(char)((ulong)in_stack_fffffffffffffe08 >> 0x38));
      *(undefined1 *)(in_RSI + 0x18) = 0;
    }
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x714336);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                  *)in_stack_fffffffffffffe10);
  }
  return in_RDI;
}

Assistant:

string_type format_dotted_table(const table_type& t, const table_format_info& fmt, // {{{
            const source_location&, std::vector<string_type>& keys)
    {
        // lets say we have: `{"a": {"b": {"c": {"d": "foo", "e": "bar"} } }`
        // and `a` and `b` are `dotted`.
        //
        // - in case if `c` is `oneline`:
        // ```toml
        // a.b.c = {d = "foo", e = "bar"}
        // ```
        //
        // - in case if and `c` is `dotted`:
        // ```toml
        // a.b.c.d = "foo"
        // a.b.c.e = "bar"
        // ```

        string_type retval;

        for(const auto& kv : t)
        {
            const auto& key = kv.first;
            const auto& val = kv.second;

            keys.push_back(key);

            // format recursive dotted table?
            if (val.is_table() &&
                val.as_table_fmt().fmt != table_format::oneline &&
                val.as_table_fmt().fmt != table_format::multiline_oneline)
            {
                retval += this->format_dotted_table(val.as_table(), val.as_table_fmt(), val.location(), keys);
            }
            else // non-table or inline tables. format normally
            {
                retval += format_comments(val.comments(), fmt.indent_type);
                retval += format_indent(fmt.indent_type);
                retval += format_keys(keys).value();
                retval += string_conv<string_type>(" = ");
                this->force_inline_ = true; // sub-table must be inlined
                retval += (*this)(val);
                retval += char_type('\n');
                this->force_inline_ = false;
            }
            keys.pop_back();
        }
        return retval;
    }